

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

void __thiscall ot::commissioner::coap::Coap::RequestsCache::UpdateTimer(RequestsCache *this)

{
  bool bVar1;
  TimePoint aFireTime;
  bool local_31;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  RequestsCache *local_10;
  RequestsCache *this_local;
  
  local_10 = this;
  bVar1 = IsEmpty(this);
  if (bVar1) {
    Timer::Stop(&this->mRetransmissionTimer);
  }
  else {
    bVar1 = Timer::IsRunning(&this->mRetransmissionTimer);
    local_31 = true;
    if (bVar1) {
      local_18.__d.__r = (duration)Earliest(this);
      local_20.__d.__r = (duration)Timer::GetFireTime(&this->mRetransmissionTimer);
      local_31 = std::chrono::operator<(&local_18,&local_20);
    }
    if (local_31 != false) {
      aFireTime = Earliest(this);
      Timer::Start(&this->mRetransmissionTimer,aFireTime);
    }
  }
  return;
}

Assistant:

void Coap::RequestsCache::UpdateTimer()
{
    if (IsEmpty())
    {
        mRetransmissionTimer.Stop();
    }
    else if (!mRetransmissionTimer.IsRunning() || Earliest() < mRetransmissionTimer.GetFireTime())
    {
        mRetransmissionTimer.Start(Earliest());
    }
}